

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall crnlib::dxt_hc::determine_tiles_task(dxt_hc *this,uint64 data,void *param_2)

{
  int *piVar1;
  tile_details *this_00;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar2;
  float fVar3;
  uint uVar4;
  color_quad_u8 (*pacVar5) [16];
  tile_details *ptVar6;
  ulong uVar7;
  double dVar8;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar9;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar10;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar11;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  uint uVar21;
  ulong uVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  undefined1 *puVar27;
  color_quad_u8 *pcVar28;
  ulong uVar29;
  byte *pbVar30;
  uint8 c;
  uint uVar31;
  int iVar32;
  int iVar33;
  byte *pbVar34;
  long lVar35;
  color_quad_u8 *block;
  undefined4 *puVar36;
  ulong uVar37;
  uint uVar38;
  ulong uVar39;
  uint *puVar40;
  uint *puVar41;
  long lVar42;
  uint e;
  bool bVar43;
  float fVar44;
  float fVar45;
  uint low16;
  params params;
  int scan [3];
  results results_1;
  int refine [4];
  results results;
  uint high16;
  etc1_optimizer optimizer;
  uint8 selectors [64];
  uint tile_error [3] [9];
  uint total_error [3] [8];
  color_quad_u8 tilePixels [128];
  color_quad_u8 block_colors [4];
  int local_9f8;
  ulong local_9f0;
  params local_9d8;
  anon_struct_16_4_e4b8e16b *local_9b8;
  ulong local_9b0;
  ulong local_9a8;
  undefined4 *local_9a0;
  undefined4 local_998;
  undefined2 local_994;
  uint local_990;
  color_quad_u8 *local_988;
  undefined1 local_980;
  undefined8 *local_978;
  undefined4 local_970;
  undefined4 uStack_96c;
  undefined1 local_968;
  long local_960;
  ulong local_958;
  uint64 local_950;
  ulong local_948;
  ulong local_940;
  float (*local_938) [8];
  undefined8 local_930;
  undefined4 local_928;
  results local_920;
  undefined8 local_908;
  undefined8 uStack_900;
  int local_8f0;
  undefined4 uStack_8ec;
  uint local_8e0;
  byte *local_8d8;
  uint16 local_8c8 [16];
  etc1_optimizer local_8a8;
  byte local_7a8 [64];
  int aiStack_768 [9];
  undefined4 local_744 [19];
  uint auStack_6f8 [8];
  uint local_6d8 [16];
  color_quad_u8 acStack_698 [2];
  undefined8 auStack_690 [3];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aaStack_678 [4];
  undefined8 auStack_668 [26];
  undefined8 local_598;
  undefined4 auStack_590 [62];
  undefined1 local_498 [16];
  uchar *local_488;
  
  local_8a8.m_sorted_luma[1].m_p = (uint *)0x0;
  local_8a8.m_sorted_luma[1].m_size = 0;
  local_8a8.m_sorted_luma[1].m_capacity = 0;
  local_8a8.m_sorted_luma[0].m_p = (uint *)0x0;
  local_8a8.m_sorted_luma[0].m_size = 0;
  local_8a8.m_sorted_luma[0].m_capacity = 0;
  local_8a8.m_luma.m_p = (unsigned_short *)0x0;
  local_8a8.m_luma.m_size = 0;
  local_8a8.m_luma.m_capacity = 0;
  local_8a8.m_best_solution.m_selectors.m_p = (uchar *)0x0;
  local_8a8.m_best_solution.m_selectors.m_size = 0;
  local_8a8.m_best_solution.m_selectors.m_capacity = 0;
  local_8a8.m_selectors.m_p = (uchar *)0x0;
  local_8a8.m_selectors.m_size = 0;
  local_8a8.m_selectors.m_capacity = 0;
  local_8a8.m_best_selectors.m_p = (uchar *)0x0;
  local_8a8.m_best_selectors.m_size._0_1_ = 0;
  local_8a8.m_best_selectors._9_7_ = 0;
  local_8a8.m_best_solution.m_coords.m_unscaled_color.field_0.field_0.r = '\0';
  local_8a8.m_best_solution.m_coords._1_8_ = 0;
  local_8a8.m_best_solution.m_error = 0xffffffffffffffff;
  local_8a8.m_best_solution.m_valid = false;
  local_8a8.m_trial_solution.m_coords.m_unscaled_color.field_0 =
       (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  local_8a8.m_trial_solution.m_coords.m_inten_table = 0;
  local_8a8.m_trial_solution.m_coords.m_color4 = false;
  local_8a8.m_trial_solution.m_selectors.m_p = (uchar *)0x0;
  local_8a8.m_trial_solution.m_selectors.m_size = 0;
  local_8a8.m_trial_solution.m_selectors.m_capacity = 0;
  local_8a8.m_trial_solution.m_error = 0xffffffffffffffff;
  local_8a8.m_trial_solution.m_valid = false;
  local_8a8.m_temp_selectors.m_p = (uchar *)0x0;
  local_8a8.m_temp_selectors.m_size = 0;
  local_8a8.m_temp_selectors.m_capacity = 0;
  local_8a8.m_pParams = (params *)0x0;
  local_8a8.m_pResult = (results *)0x0;
  local_8a8.m_pSorted_luma_indices = (uint32 *)0x0;
  local_8a8.m_pSorted_luma = (uint32 *)0x0;
  local_998 = 2;
  local_994 = 1;
  local_990 = 0;
  local_988 = (color_quad_u8 *)0x0;
  local_980 = 0;
  local_978 = (undefined8 *)&etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
  local_970 = 1;
  uStack_96c = 0;
  local_968 = 0;
  local_8d8 = local_7a8;
  local_930 = 0xffffffff;
  local_928 = 1;
  local_908 = 0xfffffffefffffffd;
  uStack_900 = 0x300000002;
  if ((this->m_params).m_num_levels != 0) {
    local_9b0 = (ulong)(this->m_pTask_pool->m_num_threads + 1);
    local_9b8 = (this->m_params).m_levels;
    local_960 = data + 1;
    local_938 = this->m_color_derating;
    uVar39 = 0;
    local_950 = data;
    do {
      uVar4 = local_9b8[uVar39].m_block_width;
      uVar37 = (ulong)uVar4;
      uVar29 = local_9b8[uVar39].m_num_blocks / uVar37;
      uVar7 = uVar29 / (this->m_params).m_num_faces;
      uVar31 = (uint)((uVar29 * data) / local_9b0) & 0xfffffffe;
      local_9f0 = (ulong)uVar31;
      uVar24 = (uint)((uVar29 * local_960) / local_9b0) & 0xfffffffe;
      local_958 = (ulong)uVar24;
      local_9a8 = uVar39;
      if (uVar31 < uVar24) {
        fVar3 = local_9b8[uVar39].m_weight;
        uVar24 = uVar31 * uVar4 + local_9b8[uVar39].m_first_block;
        uVar39 = local_9f0 % uVar7;
        local_948 = uVar37;
        do {
          iVar33 = (int)uVar39;
          if (iVar33 == (int)uVar7) {
            uVar31 = 2;
            local_9f8 = 4;
            uVar39 = (ulong)uVar24;
          }
          else {
            local_9f8 = (uint)((uVar39 & 2) == 0) * 8 + -4;
            uVar39 = (ulong)(((iVar33 << 0x1e) >> 0x1f & uVar4 * 2 - 4) + uVar24);
            uVar31 = iVar33 + 2;
          }
          uVar25 = uVar24 + (int)uVar37;
          uVar22 = (ulong)uVar24;
          uVar29 = local_940;
          while (local_940 = uVar22, iVar33 = (int)uVar37, uVar24 < uVar25) {
            pacVar5 = this->m_blocks;
            uVar29 = 0;
            do {
              iVar32 = iVar33;
              if ((uVar29 & 0x10) == 0) {
                iVar32 = 0;
              }
              uVar24 = (((int)local_940 + 1) - (uint)(uVar29 < 0x20)) + iVar32;
              uVar16 = *(undefined8 *)pacVar5[uVar24];
              uVar17 = *(undefined8 *)(pacVar5[uVar24] + 2);
              uVar18 = *(undefined8 *)(pacVar5[uVar24] + 4);
              uVar19 = *(undefined8 *)(pacVar5[uVar24] + 4 + 2);
              paVar2 = &pacVar5[uVar24][8].field_0;
              aVar9 = *paVar2;
              aVar10 = paVar2[1];
              aVar11 = paVar2[2];
              aVar12 = paVar2[3];
              uVar20 = *(undefined8 *)(pacVar5[uVar24] + 0xc + 2);
              *(undefined8 *)((long)auStack_668 + uVar29 * 4) =
                   *(undefined8 *)(pacVar5[uVar24] + 0xc);
              *(undefined8 *)((long)&local_598 + (uVar29 - 0x32) * 4) = uVar20;
              aaStack_678[uVar29] = aVar9;
              aaStack_678[uVar29 + 1] = aVar10;
              aaStack_678[uVar29 + 2] = aVar11;
              aaStack_678[uVar29 + 3] = aVar12;
              *(undefined8 *)(aaStack_678 + (uVar29 - 4)) = uVar18;
              *(undefined8 *)(aaStack_678 + (uVar29 - 2)) = uVar19;
              *(undefined8 *)(acStack_698 + uVar29) = uVar16;
              *(undefined8 *)((long)auStack_690 + uVar29 * 4) = uVar17;
              bVar43 = uVar29 < 0x30;
              uVar29 = uVar29 + 0x10;
            } while (bVar43);
            pacVar5 = this->m_blocks;
            uVar29 = 0;
            do {
              iVar32 = iVar33;
              if (uVar29 < 0x20) {
                iVar32 = 0;
              }
              puVar36 = (undefined4 *)
                        ((long)&pacVar5[iVar32 + (int)local_940 +
                                        (uint)(((uint)uVar29 >> 2 & 1) != 0)][0].field_0 +
                        (ulong)((uint)uVar29 & 0x18) * 2);
              uVar13 = puVar36[1];
              uVar14 = puVar36[2];
              uVar15 = puVar36[3];
              *(undefined4 *)((long)&local_598 + uVar29 * 4) = *puVar36;
              *(undefined4 *)((long)&local_598 + (uVar29 + 1) * 4) = uVar13;
              *(undefined4 *)((long)&local_598 + (uVar29 + 2) * 4) = uVar14;
              *(undefined4 *)((long)&local_598 + (uVar29 + 3) * 4) = uVar15;
              bVar43 = uVar29 < 0x3c;
              uVar29 = uVar29 + 4;
            } while (bVar43);
            local_9a0 = local_744;
            uVar29 = 0;
            uVar38 = (uint)uVar39;
            do {
              uVar24 = 0x10 << ((byte)(uVar29 >> 2) & 0x1f);
              block = acStack_698 + (uint)(&DAT_001ac1b0)[uVar29];
              if (this->m_has_etc_color_blocks == true) {
                local_990 = uVar24;
                local_988 = block;
                local_8e0 = uVar24;
                etc1_optimizer::init(&local_8a8,(EVP_PKEY_CTX *)&local_998);
                local_978 = &local_930;
                local_970 = 3;
                etc1_optimizer::compute(&local_8a8);
                if ((ulong)(local_990 * 0x177) < CONCAT44(uStack_8ec,local_8f0)) {
                  local_978 = &local_908;
                  local_970 = 4;
                  etc1_optimizer::compute(&local_8a8);
                }
                aiStack_768[uVar29] = local_8f0;
              }
              else if (this->m_has_color_blocks == true) {
                dxt_fast::compress_color_block
                          (uVar24,block,&local_9d8.m_block_index,(uint *)local_8c8,local_7a8,false);
                dxt1_block::get_block_colors4
                          ((color_quad_u8 *)local_498,(uint16)local_9d8.m_block_index,local_8c8[0]);
                uVar39 = 0;
                iVar33 = 0;
                pcVar28 = block;
                do {
                  lVar42 = 0;
                  do {
                    iVar32 = (uint)(pcVar28->field_0).c[lVar42] -
                             (uint)(byte)local_498[lVar42 + (ulong)local_7a8[uVar39] * 4];
                    iVar33 = iVar33 + iVar32 * iVar32;
                    lVar42 = lVar42 + 1;
                  } while (lVar42 != 3);
                  uVar39 = uVar39 + 1;
                  pcVar28 = pcVar28 + 1;
                } while (uVar39 != uVar24);
                aiStack_768[uVar29] = iVar33;
              }
              if (this->m_num_alpha_blocks != 0) {
                uVar39 = 0;
                puVar36 = local_9a0;
                do {
                  uVar21 = (this->m_params).m_alpha_component_indices[uVar39];
                  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer
                            ((dxt5_endpoint_optimizer *)local_498);
                  local_9d8.m_block_index = 0;
                  local_9d8.m_use_both_block_types = false;
                  local_9d8.m_quality = cCRNDXTQualityNormal;
                  local_9d8.m_comp_index = (uint)(byte)uVar21;
                  local_920.m_pSelectors = local_7a8;
                  local_9d8.m_pPixels = block;
                  local_9d8.m_num_pixels = uVar24;
                  dxt5_endpoint_optimizer::compute
                            ((dxt5_endpoint_optimizer *)local_498,&local_9d8,&local_920);
                  dxt5_block::get_block_values8
                            ((uint *)local_8c8,(uint)local_920.m_first_endpoint,
                             (uint)local_920.m_second_endpoint);
                  uVar39 = uVar39 + 1;
                  *puVar36 = (undefined4)local_920.m_error;
                  dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer
                            ((dxt5_endpoint_optimizer *)local_498);
                  puVar36 = puVar36 + 9;
                } while (uVar39 < this->m_num_alpha_blocks);
              }
              uVar29 = uVar29 + 1;
              local_9a0 = local_9a0 + 1;
            } while (uVar29 != 9);
            uVar24 = this->m_has_color_blocks ^ 1;
            uVar39 = (ulong)uVar24;
            uVar21 = this->m_num_alpha_blocks;
            while (uVar24 < uVar21 + 1) {
              pbVar30 = &DAT_001ac170;
              uVar29 = 0;
              do {
                piVar1 = (int *)((long)auStack_6f8 + uVar29 * 4 + (ulong)(uint)((int)uVar39 << 5));
                *piVar1 = 0;
                uVar29 = uVar29 + 1;
                iVar33 = 0;
                uVar37 = uVar29 & 0xffffffff;
                pbVar34 = pbVar30;
                do {
                  iVar33 = iVar33 + aiStack_768[uVar39 * 9 + (ulong)*pbVar34];
                  bVar23 = (byte)uVar37;
                  uVar37 = (ulong)(bVar23 >> 1);
                  pbVar34 = pbVar34 + 1;
                } while (1 < bVar23);
                *piVar1 = iVar33;
                pbVar30 = pbVar30 + 4;
              } while (uVar29 != 8);
              bVar23 = (char)uVar39 + 1;
              uVar39 = (ulong)bVar23;
              uVar24 = (uint)bVar23;
            }
            fVar44 = 0.0;
            uVar29 = 0;
            puVar40 = local_6d8;
            uVar39 = 0;
            do {
              fVar45 = 0.0;
              if (this->m_has_color_blocks == true) {
                dVar8 = 999999.0;
                if (auStack_6f8[uVar29] != 0) {
                  dVar8 = (double)auStack_6f8[uVar29] / 192.0;
                  if (dVar8 < 0.0) {
                    dVar8 = sqrt(dVar8);
                  }
                  else {
                    dVar8 = SQRT(dVar8);
                  }
                  dVar8 = log10(255.0 / dVar8);
                  dVar8 = dVar8 * 20.0;
                }
                fVar45 = 1.0;
                if (this->m_num_alpha_blocks != 0) {
                  fVar45 = (this->m_params).m_adaptive_tile_color_alpha_weighting_ratio;
                }
                dVar8 = dVar8 - (double)local_938[local_9a8][uVar29];
                if (dVar8 <= 0.0) {
                  dVar8 = 0.0;
                }
                fVar45 = (float)dVar8 * fVar45;
              }
              if (this->m_num_alpha_blocks != 0) {
                uVar37 = 0;
                puVar41 = puVar40;
                do {
                  dVar8 = 999999.0;
                  if (*puVar41 != 0) {
                    dVar8 = (double)*puVar41 * 0.015625;
                    if (dVar8 < 0.0) {
                      dVar8 = sqrt(dVar8);
                    }
                    else {
                      dVar8 = SQRT(dVar8);
                    }
                    dVar8 = log10(255.0 / dVar8);
                    dVar8 = dVar8 * 20.0;
                  }
                  uVar37 = uVar37 + 1;
                  dVar8 = dVar8 - (double)this->m_alpha_derating[uVar29];
                  if (dVar8 <= 0.0) {
                    dVar8 = 0.0;
                  }
                  fVar45 = fVar45 + (float)dVar8;
                  puVar41 = puVar41 + 8;
                } while (uVar37 < this->m_num_alpha_blocks);
              }
              if (fVar44 < fVar45) {
                uVar39 = uVar29 & 0xffffffff;
                fVar44 = fVar45;
              }
              uVar29 = uVar29 + 1;
              puVar40 = puVar40 + 1;
            } while (uVar29 != 8);
            lVar42 = 0;
            uVar24 = (int)uVar39 + 1;
            do {
              uVar26 = uVar38 | (uint)lVar42;
              ptVar6 = (this->m_tiles).m_p;
              this_00 = ptVar6 + uVar26;
              vector<crnlib::color_quad<unsigned_char,_int>_>::append
                        (&this_00->pixels,
                         acStack_698 +
                         (uint)(&DAT_001ac1b0)[(byte)(&DAT_001ac170)[lVar42 + uVar39 * 4]],
                         0x10 << ((byte)(&DAT_001ac170)[lVar42 + uVar39 * 4] >> 2 & 0x1f));
              this_00->weight = fVar3;
              if (this->m_has_color_blocks == true) {
                palettize_color((vec6F *)local_498,this,(this_00->pixels).m_p,
                                (this_00->pixels).m_size);
                *(uchar **)((this_00->color_endpoint).m_s + 4) = local_488;
                *(undefined8 *)(this_00->color_endpoint).m_s = local_498._0_8_;
                *(undefined8 *)((this_00->color_endpoint).m_s + 2) = local_498._8_8_;
              }
              if (this->m_num_alpha_blocks != 0) {
                uVar29 = 0;
                do {
                  palettize_alpha((dxt_hc *)local_498,(color_quad_u8 *)this,
                                  (uint)(this_00->pixels).m_p,(this_00->pixels).m_size);
                  *(undefined8 *)ptVar6[uVar26].alpha_endpoints[uVar29].m_s = local_498._0_8_;
                  uVar29 = uVar29 + 1;
                } while (uVar29 < this->m_num_alpha_blocks);
              }
              lVar42 = lVar42 + 1;
              bVar43 = 1 < uVar24;
              uVar24 = uVar24 >> 1;
            } while (bVar43);
            puVar27 = g_tile_map + uVar39 * 4;
            lVar42 = 0;
            do {
              iVar33 = (int)local_948;
              if (lVar42 == 0) {
                iVar33 = 0;
              }
              lVar35 = 0;
              do {
                uVar24 = iVar33 + (int)local_940 + (int)lVar35;
                (this->m_block_encodings).m_p[uVar24] = (uchar)uVar39;
                (this->m_tile_indices).m_p[uVar24] = (byte)puVar27[lVar35] | uVar38;
                lVar35 = lVar35 + 1;
              } while (lVar35 == 1);
              puVar27 = puVar27 + 2;
              bVar43 = lVar42 == 0;
              lVar42 = lVar42 + 1;
            } while (bVar43);
            uVar24 = (int)local_940 + 2;
            uVar39 = (ulong)(uVar38 + local_9f8);
            data = local_950;
            uVar22 = (ulong)uVar24;
            uVar37 = local_948;
            uVar29 = local_940;
          }
          uVar25 = (int)local_9f0 + 2;
          local_9f0 = (ulong)uVar25;
          uVar24 = uVar24 + iVar33;
          uVar39 = (ulong)uVar31;
          local_940 = uVar29;
        } while (uVar25 < (uint)local_958);
      }
      uVar39 = local_9a8 + 1;
    } while (uVar39 < (this->m_params).m_num_levels);
  }
  etc1_optimizer::~etc1_optimizer(&local_8a8);
  return;
}

Assistant:

void dxt_hc::determine_tiles_task(uint64 data, void*)
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint offsets[9] = { 0, 16, 32, 48, 0, 32, 64, 96, 64 };
        uint8 tiles[8][4] = { { 8 }, { 6, 7 }, { 4, 5 }, { 6, 1, 3 }, { 7, 0, 2 }, { 4, 2, 3 }, { 5, 0, 1 }, { 0, 2, 1, 3 } };
        color_quad_u8 tilePixels[128];
        uint8 selectors[64];
        uint tile_error[3][9];
        uint total_error[3][8];

        etc1_optimizer optimizer;
        etc1_optimizer::params params;
        params.m_use_color4 = false;
        params.m_constrain_against_base_color5 = false;
        etc1_optimizer::results results;
        results.m_pSelectors = selectors;
        int scan[] = { -1, 0, 1 };
        int refine[] = { -3, -2, 2, 3 };

        for (uint level = 0; level < m_params.m_num_levels; level++)
        {
            float weight = m_params.m_levels[level].m_weight;
            uint width = m_params.m_levels[level].m_block_width;
            uint height = m_params.m_levels[level].m_num_blocks / width;
            uint faceHeight = height / m_params.m_num_faces;
            uint h = height * data / num_tasks & ~1;
            uint hEnd = height * (data + 1) / num_tasks & ~1;
            uint hFace = h % faceHeight;
            uint b = m_params.m_levels[level].m_first_block + h * width;

            for (; h < hEnd; h += 2, hFace += 2, b += width)
            {
                uint tile_offset = b;
                uint tile_offset_delta = 4;
                if (hFace == faceHeight)
                {
                    hFace = 0;
                }
                else if (hFace & 2)
                {
                    tile_offset_delta = -4;
                    tile_offset += (width << 1) + tile_offset_delta;
                }
                for (uint bNext = b + width; b < bNext; b += 2, tile_offset += tile_offset_delta)
                {
                    for (int t = 0; t < 64; t += 16)
                    {
                        memcpy(tilePixels + t, m_blocks[b + (t & 16 ? width : 0) + (t & 32 ? 1 : 0)], 64);
                    }
                    for (int t = 0; t < 64; t += 4)
                    {
                        memcpy(tilePixels + 64 + t, m_blocks[b + (t & 32 ? width : 0) + (t & 4 ? 1 : 0)] + (t >> 1 & 12), 16);
                    }

                    for (uint t = 0; t < 9; t++)
                    {
                        color_quad_u8* pixels = tilePixels + offsets[t];
                        uint size = 16 << (t >> 2);
                        if (m_has_etc_color_blocks)
                        {
                            params.m_pSrc_pixels = pixels;
                            params.m_num_src_pixels = results.m_n = size;
                            optimizer.init(params, results);
                            params.m_pScan_deltas = scan;
                            params.m_scan_delta_size = sizeof(scan) / sizeof(*scan);
                            optimizer.compute();
                            if (results.m_error > 375 * params.m_num_src_pixels)
                            {
                                params.m_pScan_deltas = refine;
                                params.m_scan_delta_size = sizeof(refine) / sizeof(*refine);
                                optimizer.compute();
                            }
                            tile_error[cColor][t] = results.m_error;
                        }
                        else if (m_has_color_blocks)
                        {
                            uint low16, high16;
                            dxt_fast::compress_color_block(size, pixels, low16, high16, selectors);
                            color_quad_u8 block_colors[4];
                            dxt1_block::get_block_colors4(block_colors, low16, high16);
                            uint error = 0;
                            for (uint p = 0; p < size; p++)
                            {
                                for (uint8 c = 0; c < 3; c++)
                                {
                                    uint delta = pixels[p][c] - block_colors[selectors[p]][c];
                                    error += delta * delta;
                                }
                            }
                            tile_error[cColor][t] = error;
                        }
                        for (uint a = 0; a < m_num_alpha_blocks; a++)
                        {
                            uint8 component = m_params.m_alpha_component_indices[a];
                            dxt5_endpoint_optimizer optimizer;
                            dxt5_endpoint_optimizer::params params;
                            dxt5_endpoint_optimizer::results results;
                            params.m_pPixels = pixels;
                            params.m_num_pixels = size;
                            params.m_comp_index = component;
                            params.m_use_both_block_types = false;
                            params.m_quality = cCRNDXTQualityNormal;
                            results.m_pSelectors = selectors;
                            optimizer.compute(params, results);
                            uint block_values[cDXT5SelectorValues];
                            dxt5_block::get_block_values8(block_values, results.m_first_endpoint, results.m_second_endpoint);
                            tile_error[cAlpha0 + a][t] = results.m_error;
                        }
                    }

                    for (uint8 c = m_has_color_blocks ? 0 : cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++)
                    {
                        for (uint8 e = 0; e < 8; e++)
                        {
                            total_error[c][e] = 0;
                            for (uint8 t = 0, s = e + 1; s; s >>= 1, t++)
                            {
                                total_error[c][e] += tile_error[c][tiles[e][t]];
                            }
                        }
                    }

                    float best_quality = 0.0f;
                    uint best_encoding = 0;
                    for (uint e = 0; e < 8; e++)
                    {
                        float quality = 0;
                        if (m_has_color_blocks)
                        {
                            double peakSNR = total_error[cColor][e] ? log10(255.0f / sqrt(total_error[cColor][e] / 192.0)) * 20.0f : 999999.0f;
                            quality = (float)math::maximum<double>(peakSNR - m_color_derating[level][e], 0.0f);
                            if (m_num_alpha_blocks)
                            {
                                quality *= m_params.m_adaptive_tile_color_alpha_weighting_ratio;
                            }
                        }
                        for (uint a = 0; a < m_num_alpha_blocks; a++)
                        {
                            double peakSNR = total_error[cAlpha0 + a][e] ? log10(255.0f / sqrt(total_error[cAlpha0 + a][e] / 64.0)) * 20.0f : 999999.0f;
                            quality += (float)math::maximum<double>(peakSNR - m_alpha_derating[e], 0.0f);
                        }
                        if (quality > best_quality)
                        {
                            best_quality = quality;
                            best_encoding = e;
                        }
                    }

                    for (uint tile_index = 0, s = best_encoding + 1; s; s >>= 1, tile_index++)
                    {
                        tile_details& tile = m_tiles[tile_offset | tile_index];
                        uint t = tiles[best_encoding][tile_index];
                        tile.pixels.append(tilePixels + offsets[t], 16 << (t >> 2));
                        tile.weight = weight;
                        if (m_has_color_blocks)
                        {
                            tile.color_endpoint = palettize_color(tile.pixels.get_ptr(), tile.pixels.size());
                        }
                        for (uint a = 0; a < m_num_alpha_blocks; a++)
                        {
                            tile.alpha_endpoints[a] = palettize_alpha(tile.pixels.get_ptr(), tile.pixels.size(), m_params.m_alpha_component_indices[a]);
                        }
                    }

                    for (uint by = 0; by < 2; by++)
                    {
                        for (uint bx = 0; bx < 2; bx++)
                        {
                            m_block_encodings[b + (by ? width : 0) + bx] = best_encoding;
                            m_tile_indices[b + (by ? width : 0) + bx] = tile_offset | g_tile_map[best_encoding][by][bx];
                        }
                    }
                }
            }
        }
    }